

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallDirectoryGenerator::~cmInstallDirectoryGenerator(cmInstallDirectoryGenerator *this)

{
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallDirectoryGenerator_0059cc48;
  std::__cxx11::string::~string((string *)&this->LiteralArguments);
  std::__cxx11::string::~string((string *)&this->DirPermissions);
  std::__cxx11::string::~string((string *)&this->FilePermissions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Directories);
  cmInstallGenerator::~cmInstallGenerator(&this->super_cmInstallGenerator);
  return;
}

Assistant:

cmInstallDirectoryGenerator
::~cmInstallDirectoryGenerator()
{
}